

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_encoder.h
# Opt level: O0

uint32_t __thiscall
draco::DynamicIntegerPointsKdTreeEncoder<6>::
GetAndEncodeAxis<draco::PointDVector<unsigned_int>::PointDVectorIterator>
          (DynamicIntegerPointsKdTreeEncoder<6> *this,PointDVectorIterator begin,
          PointDVectorIterator end,VectorUint32 *old_base,VectorUint32 *levels,uint32_t last_axis)

{
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  const_reference pvVar4;
  reference pvVar5;
  uint *puVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  int *in_RDI;
  uint32_t i_1;
  uint32_t max_value;
  PointDVectorIterator it;
  uint32_t split;
  uint32_t i;
  uint32_t size;
  uint32_t axis;
  uint32_t best_axis;
  undefined4 in_stack_ffffffffffffff58;
  value_type vVar7;
  int in_stack_ffffffffffffff5c;
  value_type in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  value_type in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint local_6c;
  value_type local_68;
  uint local_64;
  ulong local_60;
  PseudoPointD<unsigned_int> local_58;
  PointDVectorIterator local_48;
  uint local_30;
  uint local_2c;
  int local_28;
  uint local_24;
  uint local_20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_10;
  
  local_20 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar3 = PointDVector<unsigned_int>::PointDVectorIterator::operator-
                    ((PointDVectorIterator *)&stack0x00000020,
                     (PointDVectorIterator *)&stack0x00000008);
  if (sVar3 < 0x40) {
    for (local_24 = 1; local_24 < (uint)in_RDI[2]; local_24 = local_24 + 1) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_18,(ulong)local_20);
      vVar7 = *pvVar4;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_18,(ulong)local_24);
      if (*pvVar4 < vVar7) {
        local_20 = local_24;
      }
    }
  }
  else {
    sVar3 = PointDVector<unsigned_int>::PointDVectorIterator::operator-
                      ((PointDVectorIterator *)&stack0x00000020,
                       (PointDVectorIterator *)&stack0x00000008);
    local_28 = (int)sVar3;
    for (local_2c = 0; local_2c < (uint)in_RDI[2]; local_2c = local_2c + 1) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1ea),
                          (ulong)local_2c);
      *pvVar5 = 0;
      in_stack_ffffffffffffff6c = *in_RDI;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_18,(ulong)local_2c);
      in_stack_ffffffffffffff70 = in_stack_ffffffffffffff6c - *pvVar4;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1f0),
                          (ulong)local_2c);
      *pvVar5 = in_stack_ffffffffffffff70;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1f0),
                          (ulong)local_2c);
      if (*pvVar5 != 0) {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (local_10,(ulong)local_2c);
        in_stack_ffffffffffffff68 = *pvVar4;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1f0),
                            (ulong)local_2c);
        local_30 = in_stack_ffffffffffffff68 + (1 << ((char)*pvVar5 - 1U & 0x1f));
        while (bVar2 = PointDVector<unsigned_int>::PointDVectorIterator::operator!=
                                 (&local_48,(PointDVectorIterator *)&stack0x00000020), bVar2) {
          PointDVector<unsigned_int>::PointDVectorIterator::operator*
                    ((PointDVectorIterator *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          local_60 = (ulong)local_2c;
          puVar6 = PseudoPointD<unsigned_int>::operator[](&local_58,&local_60);
          bVar2 = *puVar6 < local_30;
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              (in_RDI + 0x1ea),(ulong)local_2c);
          *pvVar5 = (uint)bVar2 + *pvVar5;
          PointDVector<unsigned_int>::PointDVectorIterator::operator++(&local_48);
        }
        in_stack_ffffffffffffff5c = local_28;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1ea),
                            (ulong)local_2c);
        local_64 = in_stack_ffffffffffffff5c - *pvVar5;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1ea),
                            (ulong)local_2c);
        puVar6 = std::max<unsigned_int>(&local_64,pvVar5);
        uVar1 = *puVar6;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1ea),
                            (ulong)local_2c);
        *pvVar5 = uVar1;
      }
    }
    local_68 = 0;
    local_20 = 0;
    for (local_6c = 0; local_6c < (uint)in_RDI[2]; local_6c = local_6c + 1) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1f0),
                          (ulong)local_6c);
      if ((*pvVar5 != 0) &&
         (vVar7 = local_68,
         pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1ea)
                             ,(ulong)local_6c), vVar7 < *pvVar5)) {
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1ea),
                            (ulong)local_6c);
        local_68 = *pvVar5;
        local_20 = local_6c;
      }
    }
    DirectBitEncoder::EncodeLeastSignificantBits32
              ((DirectBitEncoder *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  }
  return local_20;
}

Assistant:

uint32_t
DynamicIntegerPointsKdTreeEncoder<compression_level_t>::GetAndEncodeAxis(
    RandomAccessIteratorT begin, RandomAccessIteratorT end,
    const VectorUint32 &old_base, const VectorUint32 &levels,
    uint32_t last_axis) {
  if (!Policy::select_axis) {
    return DRACO_INCREMENT_MOD(last_axis, dimension_);
  }

  // For many points this function selects the axis that should be used
  // for the split by keeping as many points as possible bundled.
  // In the best case we do not split the point cloud at all.
  // For lower number of points, we simply choose the axis that is refined the
  // least so far.

  DRACO_DCHECK_EQ(true, end - begin != 0);

  uint32_t best_axis = 0;
  if (end - begin < 64) {
    for (uint32_t axis = 1; axis < dimension_; ++axis) {
      if (levels[best_axis] > levels[axis]) {
        best_axis = axis;
      }
    }
  } else {
    const uint32_t size = static_cast<uint32_t>(end - begin);
    for (uint32_t i = 0; i < dimension_; i++) {
      deviations_[i] = 0;
      num_remaining_bits_[i] = bit_length_ - levels[i];
      if (num_remaining_bits_[i] > 0) {
        const uint32_t split =
            old_base[i] + (1 << (num_remaining_bits_[i] - 1));
        for (auto it = begin; it != end; ++it) {
          deviations_[i] += ((*it)[i] < split);
        }
        deviations_[i] = std::max(size - deviations_[i], deviations_[i]);
      }
    }

    uint32_t max_value = 0;
    best_axis = 0;
    for (uint32_t i = 0; i < dimension_; i++) {
      // If axis can be subdivided.
      if (num_remaining_bits_[i]) {
        // Check if this is the better axis.
        if (max_value < deviations_[i]) {
          max_value = deviations_[i];
          best_axis = i;
        }
      }
    }
    axis_encoder_.EncodeLeastSignificantBits32(4, best_axis);
  }

  return best_axis;
}